

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O1

void __thiscall yactfr::internal::PseudoErt::_validateNotEmpty(PseudoErt *this,PseudoDst *pseudoDst)

{
  PseudoDt *pPVar1;
  string msg;
  TextLocation loc;
  int iVar2;
  ostringstream ss;
  undefined8 in_stack_fffffffffffffe30;
  ostringstream local_188 [376];
  
  pPVar1 = (this->_pseudoPayloadType)._M_t.
           super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
           ._M_t.
           super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
           .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl;
  if ((pPVar1 != (PseudoDt *)0x0) && (iVar2 = (*pPVar1->_vptr_PseudoDt[3])(), (char)iVar2 == '\0'))
  {
    return;
  }
  pPVar1 = (this->_pseudoSpecCtxType)._M_t.
           super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
           ._M_t.
           super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
           .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl;
  if ((pPVar1 != (PseudoDt *)0x0) && (iVar2 = (*pPVar1->_vptr_PseudoDt[3])(), (char)iVar2 == '\0'))
  {
    return;
  }
  pPVar1 = (pseudoDst->_pseudoErCommonCtxType)._M_t.
           super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
           ._M_t.
           super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
           .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl;
  if ((pPVar1 != (PseudoDt *)0x0) && (iVar2 = (*pPVar1->_vptr_PseudoDt[3])(), (char)iVar2 == '\0'))
  {
    return;
  }
  pPVar1 = (pseudoDst->_pseudoErHeaderType)._M_t.
           super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
           ._M_t.
           super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
           .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl;
  if ((pPVar1 != (PseudoDt *)0x0) && (iVar2 = (*pPVar1->_vptr_PseudoDt[3])(), (char)iVar2 == '\0'))
  {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"Any event record would be empty (no data).",0x2a);
  std::__cxx11::stringbuf::str();
  msg.field_2._M_allocated_capacity = 0;
  msg._M_dataplus._M_p = (pointer)0x0;
  msg._M_string_length = 0;
  msg.field_2._8_8_ = in_stack_fffffffffffffe30;
  loc._colNumber = 0;
  loc._offset = 0;
  loc._lineNumber = 0;
  throwTextParseError(msg,loc);
}

Assistant:

void PseudoErt::_validateNotEmpty(const PseudoDst& pseudoDst) const
{
    /*
     * Make sure that we can't guarantee that an instance of this event
     * record type is empty.
     */
    if (_pseudoPayloadType && !_pseudoPayloadType->isEmpty()) {
        return;
    }

    if (_pseudoSpecCtxType && !_pseudoSpecCtxType->isEmpty()) {
        return;
    }

    if (pseudoDst.pseudoErCommonCtxType() && !pseudoDst.pseudoErCommonCtxType()->isEmpty()) {
        return;
    }

    if (pseudoDst.pseudoErHeaderType() && !pseudoDst.pseudoErHeaderType()->isEmpty()) {
        return;
    }

    std::ostringstream ss;

    ss << "Any event record would be empty (no data).";
    throwTextParseError(ss.str());
}